

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ReleaseTempReg(Parse *pParse,int iReg)

{
  byte bVar1;
  yColCache *local_20;
  yColCache *p;
  int i;
  int iReg_local;
  Parse *pParse_local;
  
  if ((iReg != 0) && (pParse->nTempReg < 8)) {
    local_20 = pParse->aColCache;
    for (p._0_4_ = 0; (int)p < (int)(uint)pParse->nColCache; p._0_4_ = (int)p + 1) {
      if (local_20->iReg == iReg) {
        local_20->tempReg = '\x01';
        return;
      }
      local_20 = local_20 + 1;
    }
    bVar1 = pParse->nTempReg;
    pParse->nTempReg = bVar1 + 1;
    pParse->aTempReg[bVar1] = iReg;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ReleaseTempReg(Parse *pParse, int iReg){
  if( iReg && pParse->nTempReg<ArraySize(pParse->aTempReg) ){
    int i;
    struct yColCache *p;
    for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
      if( p->iReg==iReg ){
        p->tempReg = 1;
        return;
      }
    }
    pParse->aTempReg[pParse->nTempReg++] = iReg;
  }
}